

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::findMovableSection(DateTimePickerPrivate *this,QPointF *pos)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  
  lVar3 = (this->super_DateTimeParser).sections.d.size;
  lVar2 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar2;
  }
  piVar5 = &((this->super_DateTimeParser).sections.d.ptr)->sectionWidth;
  iVar4 = -1;
  iVar6 = 0;
  do {
    if (lVar3 == lVar2) {
LAB_00169179:
      this->movableSection = iVar4;
      return;
    }
    bVar1 = iVar6 <= (int)pos->xp;
    iVar6 = iVar6 + *piVar5;
    if ((int)pos->xp < iVar6 && bVar1) {
      iVar4 = (int)lVar2;
      goto LAB_00169179;
    }
    lVar2 = lVar2 + 1;
    piVar5 = piVar5 + 0xc;
  } while( true );
}

Assistant:

void
DateTimePickerPrivate::findMovableSection( const QPointF & pos )
{
	const int x = pos.x();

	int width = 0;

	for( int i = 0; i < sections.size(); ++i )
	{
		if( x >= width && x < width + sections.at( i ).sectionWidth )
		{
			movableSection = i;
			return;
		}

		width += sections.at( i ).sectionWidth;
	}

	movableSection = -1;
}